

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathBezierCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,int num_segments)

{
  ImVector<ImVec2> *path;
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 *__src;
  ImVec2 IVar4;
  int iVar5;
  ImVec2 *__dest;
  int iVar6;
  int iVar7;
  int iVar8;
  float x1;
  float y1;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  path = &this->_Path;
  iVar8 = (this->_Path).Size;
  if (iVar8 < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
    iVar8 = path->Size;
  }
  IVar1 = (this->_Path).Data[(long)iVar8 + -1];
  x1 = IVar1.x;
  y1 = IVar1.y;
  if (num_segments == 0) {
    PathBezierToCasteljau
              (path,x1,y1,p2->x,p2->y,p3->x,p3->y,p4->x,p4->y,this->_Data->CurveTessellationTol,0);
  }
  else if (0 < num_segments) {
    iVar6 = 1;
    do {
      fVar12 = (float)iVar6 * (1.0 / (float)num_segments);
      fVar10 = 1.0 - fVar12;
      IVar1 = *p2;
      IVar2 = *p3;
      IVar3 = *p4;
      if (iVar8 == (this->_Path).Capacity) {
        if (iVar8 == 0) {
          iVar5 = 8;
        }
        else {
          iVar5 = iVar8 / 2 + iVar8;
        }
        iVar7 = iVar8 + 1;
        if (iVar8 + 1 < iVar5) {
          iVar7 = iVar5;
        }
        __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
        __src = (this->_Path).Data;
        if (__src != (ImVec2 *)0x0) {
          memcpy(__dest,__src,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = __dest;
        (this->_Path).Capacity = iVar7;
        iVar8 = (this->_Path).Size;
      }
      else {
        __dest = (this->_Path).Data;
      }
      fVar9 = fVar10 * fVar10 * fVar10;
      fVar11 = fVar10 * fVar10 * 3.0 * fVar12;
      fVar10 = fVar10 * 3.0 * fVar12 * fVar12;
      fVar12 = fVar12 * fVar12 * fVar12;
      IVar4.y = fVar12 * IVar3.y + fVar10 * IVar2.y + fVar9 * y1 + fVar11 * IVar1.y;
      IVar4.x = fVar12 * IVar3.x + fVar10 * IVar2.x + fVar9 * x1 + fVar11 * IVar1.x;
      __dest[iVar8] = IVar4;
      iVar8 = path->Size + 1;
      path->Size = iVar8;
      iVar5 = (1 - num_segments) + iVar6;
      iVar6 = iVar6 + 1;
    } while (iVar5 != 1);
  }
  return;
}

Assistant:

void ImDrawList::PathBezierCurveTo(const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        PathBezierToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, _Data->CurveTessellationTol, 0); // Auto-tessellated
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
            _Path.push_back(ImBezierCalc(p1, p2, p3, p4, t_step * i_step));
    }
}